

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata_op.cc
# Opt level: O1

PcodeOp * earliestUseInBlock(Varnode *vn,BlockBasic *bl)

{
  PcodeOp *pPVar1;
  PcodeOp *pPVar2;
  PcodeOp *pPVar3;
  _List_node_base *p_Var4;
  
  pPVar2 = (PcodeOp *)0x0;
  for (p_Var4 = (vn->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl.
                _M_node.super__List_node_base._M_next; p_Var4 != (_List_node_base *)&vn->descend;
      p_Var4 = p_Var4->_M_next) {
    pPVar1 = (PcodeOp *)p_Var4[1]._M_next;
    pPVar3 = pPVar2;
    if (((pPVar1->parent == bl) && (pPVar3 = pPVar1, pPVar2 != (PcodeOp *)0x0)) &&
       (pPVar3 = pPVar2, (pPVar1->start).order < (pPVar2->start).order)) {
      pPVar3 = pPVar1;
    }
    pPVar2 = pPVar3;
  }
  return pPVar2;
}

Assistant:

PcodeOp *earliestUseInBlock(Varnode *vn,BlockBasic *bl)

{
  list<PcodeOp *>::const_iterator iter;
  PcodeOp *res = (PcodeOp *)0;

  for(iter=vn->beginDescend();iter!=vn->endDescend();++iter) {
    PcodeOp *op = *iter;
    if (op->getParent() != bl) continue;
    if (res == (PcodeOp *)0)
      res = op;
    else {
      if (op->getSeqNum().getOrder() < res->getSeqNum().getOrder())
	res = op;
    }
  }
  return res;
}